

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

int mime_part_rewind(curl_mimepart *part)

{
  mimestate local_18;
  uint local_14;
  mimestate targetstate;
  int res;
  curl_mimepart *part_local;
  
  local_14 = 0;
  local_18 = MIMESTATE_BEGIN;
  if ((part->flags & 2) != 0) {
    local_18 = MIMESTATE_BODY;
  }
  cleanup_encoder_state(&part->encstate);
  if ((local_18 < (part->state).state) && (local_14 = 2, part->seekfunc != (curl_seek_callback)0x0))
  {
    local_14 = (*part->seekfunc)(part->arg,0,0);
    if (local_14 == 0xffffffff) {
      local_14 = 2;
    }
    else if (2 < local_14) {
      local_14 = 1;
    }
  }
  if (local_14 == 0) {
    mimesetstate(&part->state,local_18,(void *)0x0);
  }
  part->lastreadstatus = 1;
  return local_14;
}

Assistant:

static int mime_part_rewind(curl_mimepart *part)
{
  int res = CURL_SEEKFUNC_OK;
  enum mimestate targetstate = MIMESTATE_BEGIN;

  if(part->flags & MIME_BODY_ONLY)
    targetstate = MIMESTATE_BODY;
  cleanup_encoder_state(&part->encstate);
  if(part->state.state > targetstate) {
    res = CURL_SEEKFUNC_CANTSEEK;
    if(part->seekfunc) {
      res = part->seekfunc(part->arg, (curl_off_t) 0, SEEK_SET);
      switch(res) {
      case CURL_SEEKFUNC_OK:
      case CURL_SEEKFUNC_FAIL:
      case CURL_SEEKFUNC_CANTSEEK:
        break;
      case -1:    /* For fseek() error. */
        res = CURL_SEEKFUNC_CANTSEEK;
        break;
      default:
        res = CURL_SEEKFUNC_FAIL;
        break;
      }
    }
  }

  if(res == CURL_SEEKFUNC_OK)
    mimesetstate(&part->state, targetstate, NULL);

  part->lastreadstatus = 1; /* Successful read status. */
  return res;
}